

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BendStamp.hpp
# Opt level: O2

void __thiscall OpenMD::BendStamp::setMembers(BendStamp *this,tuple<int,_int,_int> *tuple)

{
  vector<int,_std::allocator<int>_> *this_00;
  _Tuple_impl<1UL,_int,_int> local_20;
  int local_18 [2];
  
  local_18[0] = (tuple->super__Tuple_impl<0UL,_int,_int,_int>).super__Head_base<0UL,_int,_false>.
                _M_head_impl;
  local_20 = (tuple->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>;
  this_00 = &this->members_;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,local_18);
  std::vector<int,_std::allocator<int>_>::push_back
            (this_00,&local_20.super__Head_base<1UL,_int,_false>._M_head_impl);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict2 *)&local_20);
  return;
}

Assistant:

void setMembers(const std::tuple<int, int, int>& tuple) {
      auto [first, second, third] = tuple;

      members_.push_back(first);
      members_.push_back(second);
      members_.push_back(third);
    }